

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

Real __thiscall NavierStokesBase::predict_velocity(NavierStokesBase *this,Real dt)

{
  initializer_list<const_amrex::MultiFab_*> iVar1;
  FArrayBox *pFVar2;
  Real RVar3;
  bool bVar4;
  NavierStokesBase *pNVar5;
  double *pdVar6;
  FArrayBox *pFVar7;
  MFIter *mfi;
  NavierStokesBase *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  Real run_time;
  int IOProc;
  bool godunov_use_ppm;
  BCRec *in_stack_00000490;
  Geometry *in_stack_00000498;
  Array4<const_double> *rho;
  Array4<const_double> *gp;
  Array4<const_double> *visc;
  Array4<double> *tf;
  Box gbx;
  FArrayBox *Ufab;
  MFIter U_mfi;
  MultiFab forcing_term;
  MultiFab *Smf;
  FillPatchIterator S_fpi;
  MultiFab *Gp;
  Real tempdt;
  int d;
  Real cflmax;
  Vector<double,_std::allocator<double>_> umax;
  MultiFab *Umf;
  FillPatchIterator U_fpi;
  MultiFab visc_terms;
  Real strt_time;
  Real prev_pres_time;
  Real prev_time;
  Real *dx;
  int nComp;
  char (*in_stack_ffffffffffffee48) [29];
  AmrLevel *in_stack_ffffffffffffee50;
  undefined4 in_stack_ffffffffffffee58;
  undefined4 in_stack_ffffffffffffee5c;
  FabArray<amrex::FArrayBox> *this_00;
  undefined4 in_stack_ffffffffffffee60;
  undefined4 in_stack_ffffffffffffee64;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_ffffffffffffee68;
  double dVar8;
  MFInfo *in_stack_ffffffffffffee70;
  FabArrayBase *in_stack_ffffffffffffee78;
  Print *in_stack_ffffffffffffee80;
  AmrLevel *in_stack_ffffffffffffee88;
  FillPatchIterator *in_stack_ffffffffffffee90;
  anon_class_256_4_43309bcd *in_stack_ffffffffffffee98;
  BCRec *in_stack_ffffffffffffeea0;
  Geometry *in_stack_ffffffffffffeea8;
  undefined8 in_stack_ffffffffffffeeb8;
  Print *in_stack_ffffffffffffeec0;
  undefined8 in_stack_ffffffffffffeec8;
  IntVect *in_stack_ffffffffffffeed0;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
  *in_stack_ffffffffffffeed8;
  Real local_1030;
  int in_stack_fffffffffffff07c;
  int in_stack_fffffffffffff080;
  int in_stack_fffffffffffff084;
  Real in_stack_fffffffffffff088;
  int in_stack_fffffffffffff094;
  MultiFab *in_stack_fffffffffffff098;
  AmrLevel *in_stack_fffffffffffff0a0;
  int in_stack_fffffffffffff0b0;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_fffffffffffff0b8;
  Geometry *in_stack_fffffffffffff0c0;
  MultiFab *in_stack_fffffffffffff0c8;
  MultiFab *in_stack_fffffffffffff0d0;
  MultiFab *in_stack_fffffffffffff0d8;
  MultiFab *in_stack_fffffffffffff0e0;
  BCRec *in_stack_fffffffffffff100;
  double local_e30;
  int local_e28;
  undefined1 local_e21;
  undefined1 local_e20 [64];
  undefined1 auStack_de0 [64];
  undefined1 auStack_da0 [64];
  undefined1 auStack_d60 [64];
  undefined1 local_d20 [64];
  undefined1 *local_ce0;
  undefined1 local_cd8 [64];
  undefined1 *local_c98;
  undefined1 local_c90 [64];
  undefined1 *local_c50;
  undefined1 local_c48 [64];
  undefined1 *local_c08;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_fffffffffffff448;
  Geometry *in_stack_fffffffffffff450;
  MultiFab *in_stack_fffffffffffff458;
  MultiFab *in_stack_fffffffffffff460;
  MultiFab *in_stack_fffffffffffff468;
  MultiFab *in_stack_fffffffffffff470;
  undefined1 local_a74 [28];
  FArrayBox *local_a58;
  undefined8 in_stack_fffffffffffff5c0;
  undefined1 local_9f0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9d8;
  pointer piStack_9d0;
  pointer local_9c8;
  MultiFab *local_838;
  FillPatchIterator local_830;
  FabArrayBase *local_620;
  double local_618;
  Real local_610;
  double local_608;
  int local_5fc;
  double local_5f8 [2];
  FabArrayBase *local_5e8;
  FabArrayBase **local_5e0;
  undefined8 local_5d8;
  undefined1 in_stack_fffffffffffffa4e;
  undefined1 in_stack_fffffffffffffa4f;
  Real in_stack_fffffffffffffa50;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_fffffffffffffa58;
  FabArrayBase *this_01;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> in_stack_fffffffffffffa68;
  FabArrayBase *in_stack_fffffffffffffa70;
  MultiFab *in_stack_fffffffffffffa78;
  MultiFab *in_stack_fffffffffffffa80;
  undefined1 local_358 [384];
  double local_1d8;
  Real local_1d0;
  Real local_1c8;
  double *local_1c0;
  undefined4 local_1b8;
  double local_20;
  char *local_10;
  
  local_20 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  if (verbose != 0) {
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffee80,(ostream *)in_stack_ffffffffffffee78);
    amrex::Print::operator<<((Print *)in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
    amrex::Print::~Print(in_stack_ffffffffffffeec0);
  }
  local_1b8 = 3;
  local_1c0 = amrex::CoordSys::CellSize(&(in_RDI->super_AmrLevel).geom.super_CoordSys);
  amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
            ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
             in_stack_ffffffffffffee50,(size_type)in_stack_ffffffffffffee48);
  local_1c8 = amrex::StateData::prevTime
                        ((StateData *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60))
  ;
  amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
            ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
             in_stack_ffffffffffffee50,(size_type)in_stack_ffffffffffffee48);
  local_1d0 = amrex::StateData::prevTime
                        ((StateData *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60))
  ;
  local_1d8 = amrex::ParallelDescriptor::second();
  nghost_force((NavierStokesBase *)0x7d3a4f);
  amrex::MFInfo::MFInfo((MFInfo *)0x7d3a8a);
  pNVar5 = (NavierStokesBase *)amrex::AmrLevel::Factory(in_stack_ffffffffffffee50);
  amrex::MultiFab::MultiFab
            ((MultiFab *)in_stack_ffffffffffffee90,(BoxArray *)in_stack_ffffffffffffee88,
             (DistributionMapping *)in_stack_ffffffffffffee80,
             (int)((ulong)in_stack_ffffffffffffee78 >> 0x20),(int)in_stack_ffffffffffffee78,
             in_stack_ffffffffffffee70,(FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffeea0);
  amrex::MFInfo::~MFInfo((MFInfo *)0x7d3ae1);
  nghost_state(pNVar5);
  pNVar5 = (NavierStokesBase *)CONCAT44((int)((ulong)pNVar5 >> 0x20),3);
  amrex::FillPatchIterator::FillPatchIterator
            (in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,
             (MultiFab *)in_stack_ffffffffffffee80,(int)((ulong)in_stack_ffffffffffffee78 >> 0x20),
             (Real)in_stack_ffffffffffffee70,(int)((ulong)in_stack_ffffffffffffee68 >> 0x20),
             (int)in_stack_ffffffffffffee68,(int)in_stack_ffffffffffffeea0);
  local_5e8 = (FabArrayBase *)
              amrex::FillPatchIterator::get_mf((FillPatchIterator *)&stack0xfffffffffffffa68);
  floor(in_RDI,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  local_5e0 = &local_5e8;
  local_5d8 = 1;
  this_01 = local_5e8;
  std::allocator<const_amrex::MultiFab_*>::allocator((allocator<const_amrex::MultiFab_*> *)0x7d3ba2)
  ;
  iVar1._M_array._4_4_ = in_stack_ffffffffffffee5c;
  iVar1._M_array._0_4_ = in_stack_ffffffffffffee58;
  iVar1._M_len._0_4_ = in_stack_ffffffffffffee60;
  iVar1._M_len._4_4_ = in_stack_ffffffffffffee64;
  amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
             in_stack_ffffffffffffee50,iVar1,(allocator_type *)pNVar5);
  amrex::FabArrayBase::nGrow(this_01,0);
  amrex::VectorMaxAbs(in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
                      (int)((ulong)in_stack_ffffffffffffeec8 >> 0x20),(int)in_stack_ffffffffffffeec8
                      ,(int)((ulong)in_stack_ffffffffffffeec0 >> 0x20));
  amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::~Vector
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)0x7d3c1a);
  std::allocator<const_amrex::MultiFab_*>::~allocator
            ((allocator<const_amrex::MultiFab_*> *)0x7d3c27);
  dVar8 = local_20;
  pdVar6 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                     ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee50,
                      (size_type)pNVar5);
  local_5f8[0] = (dVar8 * *pdVar6) / *local_1c0;
  for (local_5fc = 1; dVar8 = local_20, local_5fc < 3; local_5fc = local_5fc + 1) {
    pdVar6 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffee50,
                        (size_type)pNVar5);
    local_608 = (dVar8 * *pdVar6) / local_1c0[local_5fc];
    pdVar6 = std::max<double>(local_5f8,&local_608);
    local_5f8[0] = *pdVar6;
  }
  if ((local_5f8[0] != 0.0) || (NAN(local_5f8[0]))) {
    local_618 = cfl / local_5f8[0];
    pdVar6 = std::min<double>(&change_max,&local_618);
    local_1030 = *pdVar6;
  }
  else {
    local_1030 = change_max;
  }
  local_610 = local_1030;
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffee50,(char *)pNVar5);
  if (((bVar4) ||
      (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffee50,(char *)pNVar5), bVar4)) ||
     (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffee50,(char *)pNVar5), bVar4)) {
    local_620 = (FabArrayBase *)
                amrex::AmrLevel::get_old_data
                          (in_stack_ffffffffffffee50,(int)((ulong)pNVar5 >> 0x20));
    if (0 < (in_RDI->super_AmrLevel).level) {
      amrex::FabArrayBase::nGrow(local_620,0);
      pNVar5 = (NavierStokesBase *)((ulong)pNVar5 & 0xffffffff00000000);
      amrex::AmrLevel::FillPatch
                (in_stack_fffffffffffff0a0,in_stack_fffffffffffff098,in_stack_fffffffffffff094,
                 in_stack_fffffffffffff088,in_stack_fffffffffffff084,in_stack_fffffffffffff080,
                 in_stack_fffffffffffff07c,in_stack_fffffffffffff0b0);
    }
    if ((be_cn_theta != 1.0) || (NAN(be_cn_theta))) {
      (*(in_RDI->super_AmrLevel)._vptr_AmrLevel[0x33])(SUB84(local_1c8,0),in_RDI,local_358,0,3);
    }
    else {
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffee50,(value_type)pNVar5);
    }
    nghost_state(pNVar5);
    amrex::FillPatchIterator::FillPatchIterator
              (in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,
               (MultiFab *)in_stack_ffffffffffffee80,(int)((ulong)in_stack_ffffffffffffee78 >> 0x20)
               ,(Real)in_stack_ffffffffffffee70,(int)((ulong)in_stack_ffffffffffffee68 >> 0x20),
               (int)in_stack_ffffffffffffee68,(int)in_stack_ffffffffffffeea0);
    local_838 = amrex::FillPatchIterator::get_mf(&local_830);
    nghost_force((NavierStokesBase *)0x7d406f);
    local_9d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    piStack_9d0 = (pointer)0x0;
    local_9f0._8_8_ = (FabArrayBase *)0x0;
    local_9f0._16_8_ = (element_type *)0x0;
    local_9c8 = (pointer)0x0;
    amrex::MFInfo::MFInfo((MFInfo *)0x7d40ac);
    local_9f0._0_8_ =
         (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
    mfi = (MFIter *)local_9f0;
    amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffee50);
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_ffffffffffffee90,(BoxArray *)in_stack_ffffffffffffee88,
               (DistributionMapping *)in_stack_ffffffffffffee80,
               (int)((ulong)in_stack_ffffffffffffee78 >> 0x20),(int)in_stack_ffffffffffffee78,
               in_stack_ffffffffffffee70,(FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffeea0);
    amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
              ((DefaultFabFactory<amrex::FArrayBox> *)0x7d411c);
    amrex::MFInfo::~MFInfo((MFInfo *)0x7d4129);
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              ((MFIter *)in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               SUB81((ulong)in_stack_ffffffffffffee70 >> 0x38,0));
    while (bVar4 = amrex::MFIter::isValid((MFIter *)&stack0xfffffffffffff5b0), bVar4) {
      local_a58 = amrex::FabArray<amrex::FArrayBox>::operator[]
                            ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffee50,mfi);
      nghost_force((NavierStokesBase *)0x7d420c);
      amrex::MFIter::growntilebox
                ((MFIter *)in_stack_ffffffffffffeec0,(int)((ulong)in_stack_ffffffffffffeeb8 >> 0x20)
                );
      if (getForceVerbose != 0) {
        amrex::OutStream();
        amrex::Print::Print(in_stack_ffffffffffffee80,(ostream *)in_stack_ffffffffffffee78);
        amrex::Print::operator<<((Print *)in_stack_ffffffffffffee50,(char (*) [48])mfi);
        amrex::Print::~Print(in_stack_ffffffffffffeec0);
      }
      this_00 = (FabArray<amrex::FArrayBox> *)&stack0xfffffffffffff5b0;
      pFVar7 = amrex::FabArray<amrex::FArrayBox>::operator[]
                         ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffee50,mfi);
      RVar3 = local_1c8;
      pFVar2 = local_a58;
      mfi = (MFIter *)
            amrex::FabArray<amrex::FArrayBox>::operator[]
                      ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffee50,mfi);
      in_stack_ffffffffffffee50 =
           (AmrLevel *)((ulong)in_stack_ffffffffffffee50 & 0xffffffff00000000);
      (*(in_RDI->super_AmrLevel)._vptr_AmrLevel[0x2a])
                (SUB84(RVar3,0),in_RDI,pFVar7,local_a74,0,3,pFVar2);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),(MFIter *)this_00,
                 (int)((ulong)in_stack_ffffffffffffee50 >> 0x20));
      local_c08 = local_c48;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),(MFIter *)this_00,
                 (int)((ulong)in_stack_ffffffffffffee50 >> 0x20));
      local_c50 = local_c90;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (this_00,(MFIter *)in_stack_ffffffffffffee50);
      local_c98 = local_cd8;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (this_00,(MFIter *)in_stack_ffffffffffffee50);
      local_ce0 = local_d20;
      memcpy(local_e20,local_c08,0x3c);
      memcpy(auStack_de0,local_c50,0x3c);
      memcpy(auStack_da0,local_c98,0x3c);
      memcpy(auStack_d60,local_ce0,0x3c);
      amrex::ParallelFor<int,NavierStokesBase::predict_velocity(double)::__0,void>
                ((Box *)in_stack_ffffffffffffeea8,(int)((ulong)in_stack_ffffffffffffeea0 >> 0x20),
                 in_stack_ffffffffffffee98);
      amrex::MFIter::operator++((MFIter *)&stack0xfffffffffffff5b0);
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_ffffffffffffee50);
    EBFactory((NavierStokesBase *)0x7d44fc);
    bVar4 = amrex::EBFArrayBoxFactory::isAllRegular((EBFArrayBoxFactory *)0x7d4504);
    if (bVar4) {
      local_e21 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffee50,(char *)mfi);
      pNVar5 = (NavierStokesBase *)
               amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
                         (&in_RDI->m_bcrec_velocity_d);
      in_stack_ffffffffffffee50 = (AmrLevel *)&(in_RDI->super_AmrLevel).geom;
      Godunov::ExtrapVelToFaces
                (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (MultiFab *)in_stack_fffffffffffffa70,
                 (MultiFab *)in_stack_fffffffffffffa68._M_head_impl,(MultiFab *)this_01,
                 in_stack_fffffffffffffa58,in_stack_00000490,in_stack_00000498,
                 in_stack_fffffffffffffa50,(bool)in_stack_fffffffffffffa4f,
                 (bool)in_stack_fffffffffffffa4e);
    }
    else {
      pNVar5 = (NavierStokesBase *)
               amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
                         (&in_RDI->m_bcrec_velocity_d);
      in_stack_ffffffffffffee50 = (AmrLevel *)&(in_RDI->super_AmrLevel).geom;
      EBGodunov::ExtrapVelToFaces
                ((MultiFab *)in_stack_ffffffffffffee90,(MultiFab *)in_stack_ffffffffffffee88,
                 (MultiFab *)in_stack_ffffffffffffee80,(MultiFab *)in_stack_ffffffffffffee78,
                 (MultiFab *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,
                 in_stack_ffffffffffffeea0,in_stack_ffffffffffffeea8,
                 (Real)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
    }
    amrex::MultiFab::~MultiFab((MultiFab *)0x7d46e4);
    amrex::FillPatchIterator::~FillPatchIterator((FillPatchIterator *)in_stack_ffffffffffffee50);
  }
  else {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffee50,(char *)pNVar5);
    if (bVar4) {
      EBFactory((NavierStokesBase *)0x7d474e);
      bVar4 = amrex::EBFArrayBoxFactory::isAllRegular((EBFArrayBoxFactory *)0x7d4756);
      if (bVar4) {
        in_stack_ffffffffffffeec0 = (Print *)&in_RDI->m_bcrec_velocity;
        pNVar5 = (NavierStokesBase *)
                 amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
                           (&in_RDI->m_bcrec_velocity_d);
        MOL::ExtrapVelToFaces
                  (in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8,in_stack_fffffffffffff0d0,
                   in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8,
                   in_stack_fffffffffffff100);
      }
      else {
        pNVar5 = (NavierStokesBase *)
                 amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
                           (&in_RDI->m_bcrec_velocity_d);
        EBMOL::ExtrapVelToFaces
                  (in_stack_fffffffffffff470,in_stack_fffffffffffff468,in_stack_fffffffffffff460,
                   in_stack_fffffffffffff458,in_stack_fffffffffffff450,in_stack_fffffffffffff448,
                   (BCRec *)in_stack_fffffffffffff5c0);
      }
    }
    else {
      local_10 = "NSB::predict_velocity: Unkown advection_scheme";
      amrex::Abort_host((char *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
    }
  }
  if (1 < verbose) {
    local_e28 = amrex::ParallelDescriptor::IOProcessorNumber();
    local_e30 = amrex::ParallelDescriptor::second();
    local_e30 = local_e30 - local_1d8;
    amrex::ParallelDescriptor::ReduceRealMax<double>(&local_e30,local_e28);
    amrex::OutStream();
    amrex::Print::Print(in_stack_ffffffffffffee80,(ostream *)in_stack_ffffffffffffee78);
    amrex::Print::operator<<((Print *)in_stack_ffffffffffffee50,(char (*) [44])pNVar5);
    amrex::Print::operator<<((Print *)in_stack_ffffffffffffee50,(int *)pNVar5);
    amrex::Print::operator<<((Print *)in_stack_ffffffffffffee50,(char (*) [9])pNVar5);
    amrex::Print::operator<<((Print *)in_stack_ffffffffffffee50,(double *)pNVar5);
    amrex::Print::operator<<((Print *)in_stack_ffffffffffffee50,(char *)pNVar5);
    amrex::Print::~Print(in_stack_ffffffffffffeec0);
  }
  dVar8 = local_20 * local_610;
  amrex::Vector<double,_std::allocator<double>_>::~Vector
            ((Vector<double,_std::allocator<double>_> *)0x7d4a13);
  amrex::FillPatchIterator::~FillPatchIterator((FillPatchIterator *)in_stack_ffffffffffffee50);
  amrex::MultiFab::~MultiFab((MultiFab *)0x7d4a2d);
  return dVar8;
}

Assistant:

Real
NavierStokesBase::predict_velocity (Real  dt)
{
   BL_PROFILE("NavierStokesBase::predict_velocity()");
   if (verbose) {
      amrex::Print() << "... predict edge velocities\n";
   }
   //
   // Get simulation parameters.
   //
   const int   nComp          = AMREX_SPACEDIM;
   const Real* dx             = geom.CellSize();
   const Real  prev_time      = state[State_Type].prevTime();
   const Real  prev_pres_time = state[Press_Type].prevTime();
   const Real  strt_time      = ParallelDescriptor::second();

   //
   // Compute viscous terms at level n.
   // Ensure reasonable values in 1 grow cell.  Here, do extrap for
   // c-f/phys boundary, since we have no interpolator fn, also,
   // preserve extrap for corners at periodic/non-periodic intersections.
   //
   MultiFab visc_terms(grids,dmap,nComp,nghost_force(),MFInfo(), Factory());

   FillPatchIterator U_fpi(*this,visc_terms,nghost_state(),prev_time,State_Type,Xvel,AMREX_SPACEDIM);
   MultiFab& Umf=U_fpi.get_mf();

   // Floor small values of states to be extrapolated
   floor(Umf);

   //
   // Compute "grid cfl number" based on cell-centered time-n velocities
   //
   auto umax = VectorMaxAbs({&Umf},FabArrayBase::mfiter_tile_size,0,AMREX_SPACEDIM,Umf.nGrow());
   Real cflmax = dt*umax[0]/dx[0];
   for (int d=1; d<AMREX_SPACEDIM; ++d) {
     cflmax = std::max(cflmax,dt*umax[d]/dx[d]);
   }
   Real tempdt = cflmax==0 ? change_max : std::min(change_max,cfl/cflmax);

   if ( advection_scheme == "Godunov_PLM" || advection_scheme == "Godunov_PPM" || advection_scheme == "BDS")
   {
       MultiFab& Gp = get_old_data(Gradp_Type);
       // FillPatch Gp here, as crse data has been updated
       // only really needed on the first step of the fine subcycle
       // because level_project at this level fills Gp ghost cells.
       // OR maybe better to not FP in level_proj for level>0 and do it
       // once the first time it's needed, which is presumably here...
       if ( level > 0 )
           FillPatch(*this,Gp,Gp.nGrow(),prev_pres_time,Gradp_Type,0,AMREX_SPACEDIM);

       if (be_cn_theta != 1.0)
       {
           getViscTerms(visc_terms,Xvel,nComp,prev_time);
       }
       else
       {
           visc_terms.setVal(0.0);
       }

       FillPatchIterator S_fpi(*this,visc_terms,nghost_state(),prev_time,State_Type,Density,NUM_SCALARS);
       MultiFab& Smf=S_fpi.get_mf();

       MultiFab forcing_term( grids, dmap, AMREX_SPACEDIM, nghost_force() );

       //
       // Compute forcing
       //
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
       {
           for (MFIter U_mfi(Umf,TilingIfNotGPU()); U_mfi.isValid(); ++U_mfi)
           {
               FArrayBox& Ufab = Umf[U_mfi];
               auto const  gbx = U_mfi.growntilebox(nghost_force());

               if (getForceVerbose) {
                   Print() << "---\nA - Predict velocity:\n Calling getForce...\n";
               }

               getForce(forcing_term[U_mfi],gbx,Xvel,AMREX_SPACEDIM,prev_time,Ufab,Smf[U_mfi],0,U_mfi);

               //
               // Compute the total forcing.
               //
               auto const& tf   = forcing_term.array(U_mfi,Xvel);
               auto const& visc = visc_terms.const_array(U_mfi,Xvel);
               auto const& gp   = Gp.const_array(U_mfi);
               auto const& rho  = Smf.const_array(U_mfi);

               amrex::ParallelFor(gbx, AMREX_SPACEDIM, [tf, visc, gp, rho]
               AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
               {
                   tf(i,j,k,n) = ( tf(i,j,k,n) + visc(i,j,k,n) - gp(i,j,k,n) ) / rho(i,j,k);
               });
           }
       }

#ifdef AMREX_USE_EB
       if (!EBFactory().isAllRegular())
       {
           EBGodunov::ExtrapVelToFaces( Umf, forcing_term,
                                        AMREX_D_DECL(u_mac[0], u_mac[1], u_mac[2]),
                                        m_bcrec_velocity, m_bcrec_velocity_d.dataPtr(),
                                        geom, dt );
       }
       else
#endif
       {
           bool godunov_use_ppm = ( advection_scheme == "Godunov_PPM" ? true : false );

           Godunov::ExtrapVelToFaces( Umf, forcing_term,
                                      AMREX_D_DECL(u_mac[0], u_mac[1], u_mac[2]),
                                      m_bcrec_velocity, m_bcrec_velocity_d.dataPtr(),
                                      geom, dt,
                                      godunov_use_ppm, godunov_use_forces_in_trans );
       }

   }
   else if ( advection_scheme == "MOL" )
   {
#ifdef AMREX_USE_EB
       if (!EBFactory().isAllRegular())
       {
            EBMOL::ExtrapVelToFaces( Umf,
                                     AMREX_D_DECL(u_mac[0], u_mac[1], u_mac[2]),
                                     geom, m_bcrec_velocity,m_bcrec_velocity_d.dataPtr());
       }
       else
#endif
       {
            MOL::ExtrapVelToFaces( Umf,
                                   AMREX_D_DECL(u_mac[0], u_mac[1], u_mac[2]),
                                   geom, m_bcrec_velocity,m_bcrec_velocity_d.dataPtr());
       }
   }
   else
   {
       Abort("NSB::predict_velocity: Unkown advection_scheme");
   }

   if (verbose > 1)
   {
      const int IOProc   = ParallelDescriptor::IOProcessorNumber();
      Real      run_time = ParallelDescriptor::second() - strt_time;

      ParallelDescriptor::ReduceRealMax(run_time,IOProc);

      Print() << "NavierStokesBase::predict_velocity(): lev: " << level
              << ", time: " << run_time << '\n';
   }

   return dt*tempdt;
}